

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * hd_resize_array(hd_context *ctx,void *p,size_t count,size_t size)

{
  undefined1 auVar1 [16];
  void *np;
  size_t size_local;
  size_t count_local;
  void *p_local;
  hd_context *ctx_local;
  
  if ((count == 0) || (size == 0)) {
    hd_free(ctx,p);
    ctx_local = (hd_context *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < count) {
      hd_throw(ctx,1,"resize array (%zu x %zu bytes) failed (size_t overflow)",count,size);
    }
    ctx_local = (hd_context *)do_scavenging_realloc(ctx,p,count * size);
    if (ctx_local == (hd_context *)0x0) {
      hd_throw(ctx,1,"resize array (%zu x %zu bytes) failed",count,size);
    }
  }
  return ctx_local;
}

Assistant:

void *
hd_resize_array(hd_context *ctx, void *p, size_t count, size_t size)
{
    void *np;

    if (count == 0 || size == 0)
    {
        hd_free(ctx, p);
        return 0;
    }

    if (count > SIZE_MAX / size)
        hd_throw(ctx, HD_ERROR_MEMORY, "resize array (%zu x %zu bytes) failed (size_t overflow)", count, size);

    np = do_scavenging_realloc(ctx, p, count * size);
    if (!np)
        hd_throw(ctx, HD_ERROR_MEMORY, "resize array (%zu x %zu bytes) failed", count, size);
    return np;
}